

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.hpp
# Opt level: O2

Size_t __thiscall
cppurses::detail::Event_queue::View<(cppurses::Event::Type)0>::Move_iterator::size
          (Move_iterator *this)

{
  pthread_mutex_t *__mutex;
  pointer puVar1;
  pointer puVar2;
  
  __mutex = (pthread_mutex_t *)this->mtx_;
  std::mutex::lock((mutex *)&__mutex->__data);
  puVar1 = (this->events_->
           super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->events_->
           super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pthread_mutex_unlock(__mutex);
  return (long)puVar1 - (long)puVar2 >> 3;
}

Assistant:

auto size() const -> Size_t
            {
                Guard_t g{mtx_};
                return events_.size();
            }